

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_int64_field
          (OneofWellKnownTypes *this,Int64Value *int64_field)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  Int64Value *int64_field_local;
  OneofWellKnownTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_oneof_field(this);
  if (int64_field != (Int64Value *)0x0) {
    submessage_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)int64_field);
    message_arena = (Arena *)int64_field;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<google::protobuf::Int64Value>
                              (message_arena_00,int64_field,submessage_arena_00);
    }
    set_has_int64_field(this);
    (this->field_0)._impl_.oneof_field_.any_field_ = (Message *)message_arena;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_int64_field(::google::protobuf::Int64Value* PROTOBUF_NULLABLE int64_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (int64_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(int64_field)->GetArena();
    if (message_arena != submessage_arena) {
      int64_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, int64_field, submessage_arena);
    }
    set_has_int64_field();
    _impl_.oneof_field_.int64_field_ = int64_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.int64_field)
}